

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O3

void lj_snap_replay(jit_State *J,GCtrace *T)

{
  SnapShot *pSVar1;
  byte bVar2;
  char cVar3;
  undefined4 uVar4;
  IRIns *pIVar5;
  IRIns *pIVar6;
  bool bVar7;
  bool bVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  IRRef1 IVar12;
  uint uVar13;
  uint uVar14;
  TRef TVar15;
  TRef TVar16;
  TRef TVar17;
  ulong uVar18;
  ulong uVar19;
  IRIns *pIVar20;
  IRIns *pIVar21;
  uint uVar22;
  IRIns *pIVar23;
  IRIns *pIVar24;
  ulong uVar25;
  ulong uVar26;
  BloomFilter seen;
  uint uVar27;
  SnapEntry *map;
  
  pSVar1 = T->snap + J->exitno;
  map = T->snapmap + pSVar1->mapofs;
  bVar2 = pSVar1->nent;
  uVar18 = (ulong)bVar2;
  J->framedepth = 0;
  bVar7 = true;
  if (bVar2 != 0) {
    uVar26 = 0;
    seen = 0;
    bVar7 = false;
    do {
      uVar14 = map[uVar26];
      uVar27 = uVar14 >> 0x18;
      uVar22 = uVar14 & 0xffff;
      pIVar24 = (IRIns *)((ulong)(uVar22 * 8) + (long)T->ir);
      uVar25 = 1L << ((byte)uVar14 & 0x3f);
      if ((uVar26 != 0) && ((uVar25 & seen) != 0)) {
        uVar19 = 0;
        do {
          if ((map[uVar19] & 0xffff) == uVar22) {
            uVar13 = J->slot[map[uVar19] >> 0x18] & 0xffecffff;
            if (uVar13 != 0) goto LAB_0015403a;
            break;
          }
          uVar19 = uVar19 + 1;
        } while (uVar26 != uVar19);
      }
      seen = seen | uVar25;
      if (uVar22 < 0x8000) {
        uVar13 = 0;
        if (uVar14 != 0x1057fff) {
          uVar13 = snap_replay_const(J,pIVar24);
        }
      }
      else if (((pIVar24->field_0).prev & 0xff80) == 0x80) {
        bVar7 = true;
        uVar13 = uVar27;
      }
      else {
        uVar9 = 0x21;
        if ((pIVar24->field_1).o == 'G') {
          uVar9 = (pIVar24->field_0).op2 & 0x10 | 0x21;
        }
        (J->fold).ins.field_0.ot = (pIVar24->field_1).t.irt & 0x1f | 0x4700;
        *(ushort *)&(J->fold).ins = (ushort)(byte)(uVar14 >> 0x18);
        (J->fold).ins.field_0.op2 = (ushort)(uVar14 >> 0xe) & 0x40 | uVar9;
        uVar13 = lj_ir_emit(J);
      }
LAB_0015403a:
      J->slot[uVar27] = uVar14 & 0x130000 | uVar13;
      J->framedepth = J->framedepth + (uint)(uVar27 != 1 && (uVar14 & 0x30000) != 0);
      if ((uVar14 >> 0x10 & 1) != 0) {
        J->baseslot = uVar27 + 1;
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != uVar18);
    if ((bVar7) && (uVar18 != 0)) {
      uVar9 = pSVar1->ref;
      pIVar24 = T->ir;
      uVar26 = 0;
      bVar8 = false;
      do {
        uVar14 = map[uVar26];
        pIVar23 = T->ir;
        pIVar6 = pIVar23 + ((ulong)uVar14 & 0xffff);
        uVar22 = (uint)bVar2;
        if ((pIVar6->field_1).r == 0xfd) {
          if (J->slot[uVar14 >> 0x18] == uVar14 >> 0x18) {
            uVar14 = T->nk;
            if (uVar14 <= (pIVar6->field_0).op1) {
              snap_pref(J,(GCtrace *)&pIVar23->field_0,map,uVar22,seen,(uint)(pIVar6->field_0).op1);
              uVar14 = T->nk;
            }
            if (uVar14 <= (pIVar6->field_0).op2) {
              snap_pref(J,(GCtrace *)&T->ir->field_0,map,uVar22,seen,(uint)(pIVar6->field_0).op2);
            }
            bVar8 = true;
            pIVar23 = pIVar6;
            if ((pIVar6->field_1).o != 'T') {
LAB_00154156:
              pIVar21 = pIVar23;
              pIVar23 = pIVar21 + 1;
              if (pIVar23 < pIVar24 + uVar9) {
                if (*(char *)((long)pIVar21 + 0xe) == -2) {
                  if ((ulong)*(byte *)((long)pIVar21 + 0xf) == 0xff) {
                    uVar14 = *(byte *)((long)pIVar21 + 0xd) - 0x4a;
                    if ((4 < uVar14) || (uVar14 == 2)) goto LAB_00154156;
                    pIVar5 = T->ir;
                    pIVar20 = pIVar5 + (pIVar23->field_0).op1;
                    if (((pIVar20->field_1).o & 0xfe) == 0x38) {
                      pIVar20 = pIVar5 + (pIVar20->field_0).op1;
                    }
                    if (pIVar5 + (pIVar20->field_0).op1 != pIVar6) goto LAB_00154156;
                  }
                  else if (pIVar23 != pIVar6 + *(byte *)((long)pIVar21 + 0xf)) goto LAB_00154156;
                  TVar15 = snap_pref(J,(GCtrace *)&T->ir->field_0,map,uVar22,seen,
                                     (uint)*(ushort *)((long)pIVar21 + 10));
                  if (TVar15 == 0) {
                    snap_pref(J,(GCtrace *)&T->ir->field_0,map,uVar22,seen,
                              (uint)T->ir[*(ushort *)((long)pIVar21 + 10)].field_0.op1);
                  }
                }
                goto LAB_00154156;
              }
            }
          }
        }
        else if ((0x7fff < (uint)((ulong)uVar14 & 0xffff)) &&
                (((pIVar6->field_0).prev & 0xff80) == 0x80)) {
          TVar15 = snap_pref(J,(GCtrace *)&pIVar23->field_0,map,uVar22,seen,
                             (uint)(pIVar6->field_0).op1);
          J->slot[uVar14 >> 0x18] = TVar15;
        }
        uVar26 = uVar26 + 1;
      } while (uVar26 != uVar18);
      bVar7 = true;
      if (bVar8) {
        uVar26 = 0;
        do {
          uVar25 = (ulong)(map[uVar26] & 0xffff);
          pIVar6 = T->ir;
          if (*(char *)((long)pIVar6 + uVar25 * 8 + 6) == -3) {
            uVar14 = map[uVar26] >> 0x18;
            if (J->slot[uVar14] == uVar14) {
              pIVar23 = pIVar6 + uVar25;
              uVar10 = (pIVar23->field_0).op1;
              uVar22 = T->nk;
              uVar27 = (uint)bVar2;
              if (uVar22 <= uVar10) {
                TVar15 = snap_pref(J,(GCtrace *)&pIVar6->field_0,map,uVar27,seen,(uint)uVar10);
                uVar10 = (ushort)TVar15;
                uVar22 = T->nk;
              }
              uVar11 = (pIVar23->field_0).op2;
              if (uVar22 <= uVar11) {
                TVar15 = snap_pref(J,(GCtrace *)&T->ir->field_0,map,uVar27,seen,(uint)uVar11);
                uVar11 = (ushort)TVar15;
              }
              if ((pIVar23->field_1).o != 'T') {
                (J->fold).ins.field_0.ot = (pIVar23->field_0).ot;
                (J->fold).ins.field_0.op1 = uVar10;
                (J->fold).ins.field_0.op2 = uVar11;
                TVar15 = lj_opt_fold(J);
                J->slot[uVar14] = TVar15;
                pIVar6 = pIVar23;
joined_r0x001543ca:
                pIVar6 = pIVar6 + 1;
                if (pIVar6 < pIVar24 + uVar9) {
                  if ((pIVar6->field_1).r == 0xfe) {
                    if ((ulong)(pIVar6->field_1).s == 0xff) {
                      uVar14 = (pIVar6->field_1).o - 0x4a;
                      if ((uVar14 < 5) && (uVar14 != 2)) {
                        pIVar20 = T->ir;
                        pIVar21 = pIVar20 + (pIVar6->field_0).op1;
                        if (((pIVar21->field_1).o & 0xfe) == 0x38) {
                          pIVar21 = pIVar20 + (pIVar21->field_0).op1;
                        }
                        if (pIVar20 + (pIVar21->field_0).op1 == pIVar23) goto LAB_0015446c;
                      }
                    }
                    else if (pIVar6 == pIVar23 + (pIVar6->field_1).s) {
LAB_0015446c:
                      pIVar21 = T->ir;
                      uVar25 = (ulong)(pIVar6->field_0).op1;
                      uVar10 = *(ushort *)((long)pIVar21 + uVar25 * 8 + 2);
                      cVar3 = *(char *)((long)pIVar21 + uVar25 * 8 + 5);
                      IVar12 = (IRRef1)TVar15;
                      if (cVar3 != '>') {
                        pIVar20 = pIVar21 + uVar10;
                        if (cVar3 == '9') {
                          TVar16 = snap_replay_const(J,pIVar21 + (pIVar20->field_0).op1);
                          TVar16 = lj_ir_kslot(J,TVar16,(uint)(pIVar20->field_0).op2);
                          uVar10 = (ushort)TVar16;
                        }
                        else {
                          TVar16 = snap_replay_const(J,pIVar20);
                          uVar10 = (ushort)TVar16;
                        }
                        if ((*(byte *)((long)pIVar21 + uVar25 * 8 + 5) & 0xfe) == 0x38) {
                          uVar4 = *(undefined4 *)
                                   ((long)T->ir + (ulong)pIVar21[uVar25].field_0.op1 * 8 + 2);
                          (J->fold).ins.field_0.op1 = IVar12;
                          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = uVar4;
                          TVar16 = lj_opt_fold(J);
                          IVar12 = (IRRef1)TVar16;
                        }
                      }
                      (J->fold).ins.field_0.ot = *(IROpT *)((long)pIVar21 + uVar25 * 8 + 4);
                      (J->fold).ins.field_0.op1 = IVar12;
                      (J->fold).ins.field_0.op2 = uVar10;
                      TVar16 = lj_opt_fold(J);
                      TVar17 = snap_pref(J,(GCtrace *)&T->ir->field_0,map,uVar27,seen,
                                         (uint)(pIVar6->field_0).op2);
                      if (TVar17 == 0) {
                        TVar17 = snap_pref(J,(GCtrace *)&T->ir->field_0,map,uVar27,seen,
                                           (uint)T->ir[(pIVar6->field_0).op2].field_0.op1);
                        (J->fold).ins.field_0.op1 = (IRRef1)TVar17;
                        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
                        TVar17 = lj_opt_fold(J);
                      }
                      (J->fold).ins.field_0.ot = (pIVar6->field_0).ot;
                      (J->fold).ins.field_0.op1 = (IRRef1)TVar16;
                      (J->fold).ins.field_0.op2 = (IRRef1)TVar17;
                      lj_opt_fold(J);
                      goto joined_r0x001543ca;
                    }
                  }
                  if (((pIVar6->field_1).o == 'Z') && ((pIVar23->field_1).o == 'S')) {
                    (J->fold).ins.field_0.ot = 0x5a00;
                    (J->fold).ins.field_1.op12 = 0;
                    lj_opt_fold(J);
                  }
                  goto joined_r0x001543ca;
                }
                goto LAB_00154374;
              }
              (J->fold).ins.field_0.ot = (pIVar23->field_0).ot & 0xff9f;
              (J->fold).ins.field_0.op1 = uVar10;
              (J->fold).ins.field_0.op2 = uVar11;
              TVar15 = lj_opt_fold(J);
            }
            else {
              TVar15 = J->slot[J->slot[uVar14]];
            }
            J->slot[uVar14] = TVar15;
          }
LAB_00154374:
          uVar26 = uVar26 + 1;
        } while (uVar26 < uVar18);
        bVar7 = false;
      }
    }
    else {
      bVar7 = true;
    }
  }
  J->base = J->slot + J->baseslot;
  J->maxslot = (uint)pSVar1->nslots - J->baseslot;
  lj_snap_add(J);
  if (!bVar7) {
    (J->fold).ins.field_0.ot = 0xf80;
    (J->fold).ins.field_1.op12 = 0;
    lj_ir_emit(J);
    return;
  }
  return;
}

Assistant:

void lj_snap_replay(jit_State *J, GCtrace *T)
{
  SnapShot *snap = &T->snap[J->exitno];
  SnapEntry *map = &T->snapmap[snap->mapofs];
  MSize n, nent = snap->nent;
  BloomFilter seen = 0;
  int pass23 = 0;
  J->framedepth = 0;
  /* Emit IR for slots inherited from parent snapshot. */
  for (n = 0; n < nent; n++) {
    SnapEntry sn = map[n];
    BCReg s = snap_slot(sn);
    IRRef ref = snap_ref(sn);
    IRIns *ir = &T->ir[ref];
    TRef tr;
    /* The bloom filter avoids O(nent^2) overhead for de-duping slots. */
    if (bloomtest(seen, ref) && (tr = snap_dedup(J, map, n, ref)) != 0)
      goto setslot;
    bloomset(seen, ref);
    if (irref_isk(ref)) {
      /* See special treatment of LJ_FR2 slot 1 in snapshot_slots() above. */
      if (LJ_FR2 && (sn == SNAP(1, SNAP_FRAME | SNAP_NORESTORE, REF_NIL)))
	tr = 0;
      else
	tr = snap_replay_const(J, ir);
    } else if (!regsp_used(ir->prev)) {
      pass23 = 1;
      lj_assertJ(s != 0, "unused slot 0 in snapshot");
      tr = s;
    } else {
      IRType t = irt_type(ir->t);
      uint32_t mode = IRSLOAD_INHERIT|IRSLOAD_PARENT;
      if (LJ_SOFTFP32 && (sn & SNAP_SOFTFPNUM)) t = IRT_NUM;
      if (ir->o == IR_SLOAD) mode |= (ir->op2 & IRSLOAD_READONLY);
      if ((sn & SNAP_KEYINDEX)) mode |= IRSLOAD_KEYINDEX;
      tr = emitir_raw(IRT(IR_SLOAD, t), s, mode);
    }
  setslot:
    /* Same as TREF_* flags. */
    J->slot[s] = tr | (sn&(SNAP_KEYINDEX|SNAP_CONT|SNAP_FRAME));
    J->framedepth += ((sn & (SNAP_CONT|SNAP_FRAME)) && (s != LJ_FR2));
    if ((sn & SNAP_FRAME))
      J->baseslot = s+1;
  }
  if (pass23) {
    IRIns *irlast = &T->ir[snap->ref];
    pass23 = 0;
    /* Emit dependent PVALs. */
    for (n = 0; n < nent; n++) {
      SnapEntry sn = map[n];
      IRRef refp = snap_ref(sn);
      IRIns *ir = &T->ir[refp];
      if (regsp_reg(ir->r) == RID_SUNK) {
	if (J->slot[snap_slot(sn)] != snap_slot(sn)) continue;
	pass23 = 1;
	lj_assertJ(ir->o == IR_TNEW || ir->o == IR_TDUP ||
		   ir->o == IR_CNEW || ir->o == IR_CNEWI,
		   "sunk parent IR %04d has bad op %d", refp - REF_BIAS, ir->o);
	if (ir->op1 >= T->nk) snap_pref(J, T, map, nent, seen, ir->op1);
	if (ir->op2 >= T->nk) snap_pref(J, T, map, nent, seen, ir->op2);
	if (LJ_HASFFI && ir->o == IR_CNEWI) {
	  if (LJ_32 && refp+1 < T->nins && (ir+1)->o == IR_HIOP)
	    snap_pref(J, T, map, nent, seen, (ir+1)->op2);
	} else {
	  IRIns *irs;
	  for (irs = ir+1; irs < irlast; irs++)
	    if (irs->r == RID_SINK && snap_sunk_store(T, ir, irs)) {
	      if (snap_pref(J, T, map, nent, seen, irs->op2) == 0)
		snap_pref(J, T, map, nent, seen, T->ir[irs->op2].op1);
	      else if ((LJ_SOFTFP32 || (LJ_32 && LJ_HASFFI)) &&
		       irs+1 < irlast && (irs+1)->o == IR_HIOP)
		snap_pref(J, T, map, nent, seen, (irs+1)->op2);
	    }
	}
      } else if (!irref_isk(refp) && !regsp_used(ir->prev)) {
	lj_assertJ(ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT,
		   "sunk parent IR %04d has bad op %d", refp - REF_BIAS, ir->o);
	J->slot[snap_slot(sn)] = snap_pref(J, T, map, nent, seen, ir->op1);
      }
    }
    /* Replay sunk instructions. */
    for (n = 0; pass23 && n < nent; n++) {
      SnapEntry sn = map[n];
      IRRef refp = snap_ref(sn);
      IRIns *ir = &T->ir[refp];
      if (regsp_reg(ir->r) == RID_SUNK) {
	TRef op1, op2;
	if (J->slot[snap_slot(sn)] != snap_slot(sn)) {  /* De-dup allocs. */
	  J->slot[snap_slot(sn)] = J->slot[J->slot[snap_slot(sn)]];
	  continue;
	}
	op1 = ir->op1;
	if (op1 >= T->nk) op1 = snap_pref(J, T, map, nent, seen, op1);
	op2 = ir->op2;
	if (op2 >= T->nk) op2 = snap_pref(J, T, map, nent, seen, op2);
	if (LJ_HASFFI && ir->o == IR_CNEWI) {
	  if (LJ_32 && refp+1 < T->nins && (ir+1)->o == IR_HIOP) {
	    lj_needsplit(J);  /* Emit joining HIOP. */
	    op2 = emitir_raw(IRT(IR_HIOP, IRT_I64), op2,
			     snap_pref(J, T, map, nent, seen, (ir+1)->op2));
	  }
	  J->slot[snap_slot(sn)] = emitir(ir->ot & ~(IRT_MARK|IRT_ISPHI), op1, op2);
	} else {
	  IRIns *irs;
	  TRef tr = emitir(ir->ot, op1, op2);
	  J->slot[snap_slot(sn)] = tr;
	  for (irs = ir+1; irs < irlast; irs++)
	    if (irs->r == RID_SINK && snap_sunk_store(T, ir, irs)) {
	      IRIns *irr = &T->ir[irs->op1];
	      TRef val, key = irr->op2, tmp = tr;
	      if (irr->o != IR_FREF) {
		IRIns *irk = &T->ir[key];
		if (irr->o == IR_HREFK)
		  key = lj_ir_kslot(J, snap_replay_const(J, &T->ir[irk->op1]),
				    irk->op2);
		else
		  key = snap_replay_const(J, irk);
		if (irr->o == IR_HREFK || irr->o == IR_AREF) {
		  IRIns *irf = &T->ir[irr->op1];
		  tmp = emitir(irf->ot, tmp, irf->op2);
		}
	      }
	      tmp = emitir(irr->ot, tmp, key);
	      val = snap_pref(J, T, map, nent, seen, irs->op2);
	      if (val == 0) {
		IRIns *irc = &T->ir[irs->op2];
		lj_assertJ(irc->o == IR_CONV && irc->op2 == IRCONV_NUM_INT,
			   "sunk store for parent IR %04d with bad op %d",
			   refp - REF_BIAS, irc->o);
		val = snap_pref(J, T, map, nent, seen, irc->op1);
		val = emitir(IRTN(IR_CONV), val, IRCONV_NUM_INT);
	      } else if ((LJ_SOFTFP32 || (LJ_32 && LJ_HASFFI)) &&
			 irs+1 < irlast && (irs+1)->o == IR_HIOP) {
		IRType t = IRT_I64;
		if (LJ_SOFTFP32 && irt_type((irs+1)->t) == IRT_SOFTFP)
		  t = IRT_NUM;
		lj_needsplit(J);
		if (irref_isk(irs->op2) && irref_isk((irs+1)->op2)) {
		  uint64_t k = (uint32_t)T->ir[irs->op2].i +
			       ((uint64_t)T->ir[(irs+1)->op2].i << 32);
		  val = lj_ir_k64(J, t == IRT_I64 ? IR_KINT64 : IR_KNUM, k);
		} else {
		  val = emitir_raw(IRT(IR_HIOP, t), val,
			  snap_pref(J, T, map, nent, seen, (irs+1)->op2));
		}
		tmp = emitir(IRT(irs->o, t), tmp, val);
		continue;
	      }
	      tmp = emitir(irs->ot, tmp, val);
	    } else if (LJ_HASFFI && irs->o == IR_XBAR && ir->o == IR_CNEW) {
	      emitir(IRT(IR_XBAR, IRT_NIL), 0, 0);
	    }
	}
      }
    }
  }
  J->base = J->slot + J->baseslot;
  J->maxslot = snap->nslots - J->baseslot;
  lj_snap_add(J);
  if (pass23)  /* Need explicit GC step _after_ initial snapshot. */
    emitir_raw(IRTG(IR_GCSTEP, IRT_NIL), 0, 0);
}